

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

SSL_ECH_KEYS * SSL_ECH_KEYS_new(void)

{
  ssl_ech_keys_st *psVar1;
  
  psVar1 = bssl::New<ssl_ech_keys_st>();
  return psVar1;
}

Assistant:

SSL_ECH_KEYS *SSL_ECH_KEYS_new() { return New<SSL_ECH_KEYS>(); }